

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O0

unsigned_long
phosg::parallel_range<unsigned_long>
          (function<bool_(unsigned_long,_unsigned_long)> *fn,unsigned_long start_value,
          unsigned_long end_value,size_t num_threads,
          function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *progress_fn)

{
  bool bVar1;
  uint uVar2;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *pfVar3;
  uint64_t __args_3;
  __int_type _Var4;
  thread *t;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unsigned_long progress_current_value;
  uint64_t start_time;
  size_type local_90;
  reference_wrapper<std::atomic<unsigned_long>_> local_88;
  reference_wrapper<std::atomic<unsigned_long>_> local_80;
  reference_wrapper<std::function<bool_(unsigned_long,_unsigned_long)>_> local_78;
  undefined1 local_70 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<unsigned_long> result_value;
  atomic<unsigned_long> current_value;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *progress_fn_local;
  size_t num_threads_local;
  unsigned_long end_value_local;
  unsigned_long start_value_local;
  function<bool_(unsigned_long,_unsigned_long)> *fn_local;
  memory_order local_18;
  undefined4 local_14;
  memory_order __b;
  
  progress_fn_local =
       (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)num_threads;
  num_threads_local = end_value;
  end_value_local = start_value;
  start_value_local = (unsigned_long)fn;
  if (num_threads == 0) {
    uVar2 = ::std::thread::hardware_concurrency();
    progress_fn_local =
         (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)(ulong)uVar2
    ;
  }
  ::std::atomic<unsigned_long>::atomic(&result_value,end_value_local);
  ::std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)
             &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,num_threads_local);
  ::std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  while (pfVar3 = (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                  ::std::vector<std::thread,_std::allocator<std::thread>_>::size
                            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70),
        pfVar3 < progress_fn_local) {
    local_78 = ::std::ref<std::function<bool(unsigned_long,unsigned_long)>>(fn);
    local_80 = ::std::ref<std::atomic<unsigned_long>>(&result_value);
    local_88 = ::std::ref<std::atomic<unsigned_long>>
                         ((atomic<unsigned_long> *)
                          &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_90 = ::std::vector<std::thread,_std::allocator<std::thread>_>::size
                         ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
    ::std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(std::function<bool(unsigned_long,unsigned_long)>&,std::atomic<unsigned_long>&,std::atomic<unsigned_long>&,unsigned_long,unsigned_long),std::reference_wrapper<std::function<bool(unsigned_long,unsigned_long)>>,std::reference_wrapper<std::atomic<unsigned_long>>,std::reference_wrapper<std::atomic<unsigned_long>>,unsigned_long&,unsigned_long>
              ((vector<std::thread,std::allocator<std::thread>> *)local_70,
               parallel_range_thread_fn<unsigned_long>,&local_78,&local_80,&local_88,
               &num_threads_local,&local_90);
  }
  bVar1 = ::std::operator==(progress_fn,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    __args_3 = now();
    while( true ) {
      ___b = &result_value;
      local_14 = 5;
      local_18 = ::std::operator&(seq_cst,__memory_order_mask);
      if (num_threads_local <= (ulong)result_value.super___atomic_base<unsigned_long>._M_i) break;
      ::std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::operator()
                (progress_fn,end_value_local,num_threads_local,
                 (unsigned_long)result_value.super___atomic_base<unsigned_long>._M_i,__args_3);
      usleep(1000000);
    }
  }
  __end2 = ::std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  t = (thread *)
      ::std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&t), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    ::std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  _Var4 = ::std::__atomic_base::operator_cast_to_unsigned_long
                    ((__atomic_base *)
                     &threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  ::std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_70);
  return _Var4;
}

Assistant:

IntT parallel_range(
    std::function<bool(IntT value, size_t thread_num)> fn,
    IntT start_value,
    IntT end_value,
    size_t num_threads = 0,
    std::function<void(IntT start_value, IntT end_value, IntT current_value, uint64_t start_time_usecs)> progress_fn = parallel_range_default_progress_fn<IntT>) {
  if (num_threads == 0) {
    num_threads = std::thread::hardware_concurrency();
  }

  std::atomic<IntT> current_value(start_value);
  std::atomic<IntT> result_value(end_value);
  std::vector<std::thread> threads;
  while (threads.size() < num_threads) {
    threads.emplace_back(
        parallel_range_thread_fn<IntT>,
        std::ref(fn),
        std::ref(current_value),
        std::ref(result_value),
        end_value,
        threads.size());
  }

  if (progress_fn != nullptr) {
    uint64_t start_time = now();
    IntT progress_current_value;
    while ((progress_current_value = current_value.load()) < end_value) {
      progress_fn(start_value, end_value, progress_current_value, start_time);
      usleep(1000000);
    }
  }

  for (auto& t : threads) {
    t.join();
  }

  return result_value;
}